

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O1

void __thiscall
HawkTracer::parser::ProtocolReader::_read_event
          (ProtocolReader *this,bool *is_error,Event *event,Event *base_event)

{
  EventKlass *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  EventKlassField *pEVar1;
  bool bVar2;
  pointer psVar3;
  bool bVar4;
  FieldType value;
  FieldType local_58;
  Event *local_50;
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  local_48;
  
  this_00 = (event->_klass).
            super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (event->_klass).
            super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_50 = base_event;
  EventKlass::get_fields(&local_48,this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  bVar4 = local_48.
          super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_48.
          super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  if (!bVar4) {
    psVar3 = local_48.
             super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_58.f_UINT64 = 0;
      pEVar1 = (psVar3->
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (((((int)pEVar1->_type_id < 9) && (bVar2 = _read_numeric(this,&local_58,pEVar1), !bVar2))
          || ((((psVar3->
                super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->_type_id == STRING && (bVar2 = _read_string(this,&local_58), !bVar2)))) ||
         ((pEVar1 = (psVar3->
                    super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr, pEVar1->_type_id == STRUCT &&
          (bVar2 = _read_struct(this,&local_58,pEVar1,event,local_50), !bVar2)))) {
        *is_error = true;
        std::
        vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
        ::~vector(&local_48);
        if (!bVar4) {
          return;
        }
        goto LAB_00110e7c;
      }
      pEVar1 = (psVar3->
               super___shared_ptr<HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((this->_flat_events != true) || (pEVar1->_type_id != STRUCT)) {
        Event::set_value(event,pEVar1,local_58);
      }
      psVar3 = psVar3 + 1;
      bVar4 = psVar3 == local_48.
                        super__Vector_base<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (!bVar4);
  }
  std::
  vector<std::shared_ptr<HawkTracer::parser::EventKlassField>,_std::allocator<std::shared_ptr<HawkTracer::parser::EventKlassField>_>_>
  ::~vector(&local_48);
LAB_00110e7c:
  *is_error = false;
  return;
}

Assistant:

void ProtocolReader::_read_event(bool& is_error, Event& event, Event* base_event)
{
    for (const auto& field : event.get_klass()->get_fields())
    {
        FieldType value{};
        if (((field->is_numeric() || field->get_type_id() == FieldTypeId::POINTER) && !_read_numeric(value, *field)) || // read numeric or pointer
                (field->get_type_id() == FieldTypeId::STRING && !_read_string(value)) || // read string
                (field->get_type_id() == FieldTypeId::STRUCT && !_read_struct(value, *field, &event, base_event))) // read struct
        {
            is_error = true;
            return;
        }

        if (_flat_events)
        {
            if (field->get_type_id() != FieldTypeId::STRUCT)
            {
                event.set_value(field.get(), value);
            }
        }
        else
        {
            event.set_value(field.get(), value);
        }
    }

    is_error = false;
}